

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_extract_usm3d_mapbc(REF_GEOM ref_geom,char *mapbc)

{
  REF_STATUS RVar1;
  uint uVar2;
  int generic;
  size_t sVar3;
  char *__dest;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT bc_type_1;
  REF_SIZE i_1;
  REF_SIZE len_1;
  char *name_1;
  char *bc_name_1;
  char *attribute_1;
  REF_INT edge_id;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT bc_type;
  REF_SIZE i;
  REF_SIZE len;
  char *name;
  char *bc_name;
  char *attribute;
  REF_INT face_id;
  REF_INT usm3d_type;
  FILE *file;
  char *mapbc_local;
  REF_GEOM ref_geom_local;
  
  file = (FILE *)mapbc;
  mapbc_local = (char *)ref_geom;
  _face_id = fopen(mapbc,"w");
  if (_face_id == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (_face_id == (FILE *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0x11ae,
           "ref_egads_extract_usm3d_mapbc","unable to open file");
    ref_geom_local._4_4_ = 2;
  }
  else {
    fprintf(_face_id,"# generated from refine with EGADS atrributes\n");
    fprintf(_face_id,"# bc tags translated from known FUN3D tags when possible\n");
    fprintf(_face_id,"#\n");
    fprintf(_face_id,"# patch no.     bc      family   surfs    surfids    name\n");
    if (*(int *)(mapbc_local + 0x80) == 0) {
      bc_name_1 = (char *)0x0;
      for (attribute_1._0_4_ = 1; (int)(uint)attribute_1 <= *(int *)(mapbc_local + 0x6c);
          attribute_1._0_4_ = (uint)attribute_1 + 1) {
        RVar1 = ref_egads_get_attribute
                          ((REF_GEOM)mapbc_local,1,(uint)attribute_1,"bc_name",&bc_name_1);
        if (RVar1 != 0) {
          printf("bc_name not set for edge %d\n",(ulong)(uint)attribute_1);
          return 5;
        }
      }
      for (attribute_1._0_4_ = 1; (int)(uint)attribute_1 <= *(int *)(mapbc_local + 0x6c);
          attribute_1._0_4_ = (uint)attribute_1 + 1) {
        len_1 = 0;
        uVar2 = ref_egads_get_attribute
                          ((REF_GEOM)mapbc_local,1,(uint)attribute_1,"bc_name",&bc_name_1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11ed,"ref_egads_extract_usm3d_mapbc",(ulong)uVar2,"get");
          return uVar2;
        }
        if (bc_name_1 == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11ee,"ref_egads_extract_usm3d_mapbc","attribute NULL");
          return 2;
        }
        sVar3 = strlen(bc_name_1);
        if (9999 < sVar3) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11f0,"ref_egads_extract_usm3d_mapbc","attribute more than 10000 bytes");
          return 1;
        }
        if ((long)(sVar3 + 1) < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11f1,"ref_egads_extract_usm3d_mapbc","malloc bc_name of char negative");
          return 1;
        }
        __dest = (char *)malloc(sVar3 + 1);
        if (__dest == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11f1,"ref_egads_extract_usm3d_mapbc","malloc bc_name of char NULL");
          return 2;
        }
        strcpy(__dest,bc_name_1);
        for (_ref_private_macro_code_rss_2 = 0; _ref_private_macro_code_rss_2 < sVar3;
            _ref_private_macro_code_rss_2 = _ref_private_macro_code_rss_2 + 1) {
          if (__dest[_ref_private_macro_code_rss_2] == '_') {
            __dest[_ref_private_macro_code_rss_2] = '\n';
            len_1 = (REF_SIZE)(__dest + _ref_private_macro_code_rss_2 + 1);
            break;
          }
        }
        if (len_1 == 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11fa,"ref_egads_extract_usm3d_mapbc","underscore not found in bc_name");
          return 2;
        }
        generic = atoi(__dest);
        uVar2 = ref_phys_usm3d_bc_tag(generic,(REF_INT *)((long)&attribute + 4));
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11fc,"ref_egads_extract_usm3d_mapbc",(ulong)uVar2,"usm3d bc tags");
          return uVar2;
        }
        fprintf(_face_id,"%d %d %d %d %d %s\n",(ulong)(uint)attribute_1,(ulong)attribute._4_4_,
                (ulong)attribute._4_4_,0,0,len_1);
        if (__dest != (char *)0x0) {
          free(__dest);
        }
      }
      attribute._4_4_ = 1;
      attribute_1._0_4_ = *(int *)(mapbc_local + 0x6c) + 1;
      fprintf(_face_id,"%d %d %d %d %d %s\n",(ulong)(uint)attribute_1,1,1,0,0,"symmetry-y-min");
      attribute_1._0_4_ = *(int *)(mapbc_local + 0x6c) + 2;
      fprintf(_face_id,"%d %d %d %d %d %s\n",(ulong)(uint)attribute_1,(ulong)attribute._4_4_,
              (ulong)attribute._4_4_,0,0,"symmetry-y-max");
    }
    else {
      bc_name = (char *)0x0;
      for (attribute._0_4_ = 1; (int)(uint)attribute <= *(int *)(mapbc_local + 0x70);
          attribute._0_4_ = (uint)attribute + 1) {
        RVar1 = ref_egads_get_attribute((REF_GEOM)mapbc_local,2,(uint)attribute,"bc_name",&bc_name);
        if (RVar1 != 0) {
          printf("bc_name not set for face %d\n",(ulong)(uint)attribute);
          return 5;
        }
      }
      for (attribute._0_4_ = 1; (int)(uint)attribute <= *(int *)(mapbc_local + 0x70);
          attribute._0_4_ = (uint)attribute + 1) {
        len = 0;
        edge_id = ref_egads_get_attribute
                            ((REF_GEOM)mapbc_local,2,(uint)attribute,"bc_name",&bc_name);
        if (edge_id != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11c7,"ref_egads_extract_usm3d_mapbc",(ulong)(uint)edge_id,"get");
          return edge_id;
        }
        if (bc_name == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11c8,"ref_egads_extract_usm3d_mapbc","attribute NULL");
          return 2;
        }
        i = strlen(bc_name);
        if (9999 < i) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11ca,"ref_egads_extract_usm3d_mapbc","attribute more than 10000 bytes");
          return 1;
        }
        if ((long)(i + 1) < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11cb,"ref_egads_extract_usm3d_mapbc","malloc bc_name of char negative");
          return 1;
        }
        name = (char *)malloc(i + 1);
        if (name == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11cb,"ref_egads_extract_usm3d_mapbc","malloc bc_name of char NULL");
          return 2;
        }
        strcpy(name,bc_name);
        for (_ref_private_macro_code_rss = 0; _ref_private_macro_code_rss < i - 1;
            _ref_private_macro_code_rss = _ref_private_macro_code_rss + 1) {
          if (name[_ref_private_macro_code_rss] == '_') {
            name[_ref_private_macro_code_rss] = '\n';
            len = (REF_SIZE)(name + _ref_private_macro_code_rss + 1);
            break;
          }
        }
        if (len == 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11d4,"ref_egads_extract_usm3d_mapbc","underscore not found in bc_name");
          return 2;
        }
        ref_private_macro_code_rss_1 = atoi(name);
        attribute_1._4_4_ =
             ref_phys_usm3d_bc_tag(ref_private_macro_code_rss_1,(REF_INT *)((long)&attribute + 4));
        if (attribute_1._4_4_ != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x11d6,"ref_egads_extract_usm3d_mapbc",(ulong)attribute_1._4_4_,"usm3d bc tags");
          return attribute_1._4_4_;
        }
        fprintf(_face_id,"%d %d %d %d %d %s\n",(ulong)(uint)attribute,(ulong)attribute._4_4_,
                (ulong)attribute._4_4_,0,0,len);
        if (name != (char *)0x0) {
          free(name);
        }
      }
    }
    fclose(_face_id);
    ref_geom_local._4_4_ = 0;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_egads_extract_usm3d_mapbc(REF_GEOM ref_geom,
                                                 const char *mapbc) {
  FILE *file;
  REF_INT usm3d_type;
  file = fopen(mapbc, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc);
  RNS(file, "unable to open file");

  fprintf(file, "# generated from refine with EGADS atrributes\n");
  fprintf(file, "# bc tags translated from known FUN3D tags when possible\n");
  fprintf(file, "#\n");
  fprintf(file, "# patch no.     bc      family   surfs    surfids    name\n");

  if (ref_geom->manifold) {
    REF_INT face_id;
    const char *attribute = NULL;
    for (face_id = 1; face_id <= ref_geom->nface; face_id++) {
      if (REF_SUCCESS != ref_egads_get_attribute(ref_geom, REF_GEOM_FACE,
                                                 face_id, "bc_name",
                                                 &attribute)) {
        printf("bc_name not set for face %d\n", face_id);
        return REF_NOT_FOUND;
      }
    }
    for (face_id = 1; face_id <= ref_geom->nface; face_id++) {
      char *bc_name;
      char *name = NULL;
      REF_SIZE len, i;
      REF_INT bc_type;
      RSS(ref_egads_get_attribute(ref_geom, REF_GEOM_FACE, face_id, "bc_name",
                                  &attribute),
          "get");
      RNS(attribute, "attribute NULL");
      len = strlen(attribute);
      RAS(10000 > len, "attribute more than 10000 bytes");
      ref_malloc(bc_name, (REF_LONG)(len + 1), char);
      strcpy(bc_name, attribute);
      for (i = 0; i < len - 1; i++) {
        if ('_' == bc_name[i]) {
          bc_name[i] = '\n';
          name = &(bc_name[i + 1]);
          break;
        }
      }
      RNS(name, "underscore not found in bc_name");
      bc_type = atoi(bc_name);
      RSS(ref_phys_usm3d_bc_tag(bc_type, &usm3d_type), "usm3d bc tags");
      fprintf(file, "%d %d %d %d %d %s\n", face_id, usm3d_type, usm3d_type, 0,
              0, name);
      ref_free(bc_name);
    }
  } else {
    REF_INT edge_id;
    const char *attribute = NULL;
    for (edge_id = 1; edge_id <= ref_geom->nedge; edge_id++) {
      if (REF_SUCCESS != ref_egads_get_attribute(ref_geom, REF_GEOM_EDGE,
                                                 edge_id, "bc_name",
                                                 &attribute)) {
        printf("bc_name not set for edge %d\n", edge_id);
        return REF_NOT_FOUND;
      }
    }
    for (edge_id = 1; edge_id <= ref_geom->nedge; edge_id++) {
      char *bc_name;
      char *name = NULL;
      REF_SIZE len, i;
      REF_INT bc_type;
      RSS(ref_egads_get_attribute(ref_geom, REF_GEOM_EDGE, edge_id, "bc_name",
                                  &attribute),
          "get");
      RNS(attribute, "attribute NULL");
      len = strlen(attribute);
      RAS(10000 > len, "attribute more than 10000 bytes");
      ref_malloc(bc_name, (REF_LONG)(len + 1), char);
      strcpy(bc_name, attribute);
      for (i = 0; i < len; i++) {
        if ('_' == bc_name[i]) {
          bc_name[i] = '\n';
          name = &(bc_name[i + 1]);
          break;
        }
      }
      RNS(name, "underscore not found in bc_name");
      bc_type = atoi(bc_name);
      RSS(ref_phys_usm3d_bc_tag(bc_type, &usm3d_type), "usm3d bc tags");
      fprintf(file, "%d %d %d %d %d %s\n", edge_id, usm3d_type, usm3d_type, 0,
              0, name);
      ref_free(bc_name);
    }
    usm3d_type = 1; /* y symmetry */
    edge_id = ref_geom->nedge + 1;
    fprintf(file, "%d %d %d %d %d %s\n", edge_id, usm3d_type, usm3d_type, 0, 0,
            "symmetry-y-min");
    edge_id = ref_geom->nedge + 2;
    fprintf(file, "%d %d %d %d %d %s\n", edge_id, usm3d_type, usm3d_type, 0, 0,
            "symmetry-y-max");
  }
  fclose(file);

  return REF_SUCCESS;
}